

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

Vec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::getRandomColor(anon_unknown_1 *this,Random *rnd)

{
  float x_;
  float y_;
  float z_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Vec4 VVar2;
  float b;
  float g;
  float r;
  Random *rnd_local;
  
  x_ = de::Random::getFloat(rnd,0.2,0.9);
  y_ = de::Random::getFloat(rnd,0.2,0.9);
  z_ = de::Random::getFloat(rnd,0.2,0.9);
  uVar1 = (ulong)(uint)y_;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,x_,y_,z_,1.0);
  VVar2.m_data[2] = (float)(int)uVar1;
  VVar2.m_data[3] = (float)(int)(uVar1 >> 0x20);
  VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 getRandomColor (de::Random& rnd)
{
	const float r = rnd.getFloat(0.2f, 0.9f);
	const float g = rnd.getFloat(0.2f, 0.9f);
	const float b = rnd.getFloat(0.2f, 0.9f);
	return Vec4(r, g, b, 1.0f);
}